

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::impl::operator>>(basic_istream<char,_std::char_traits<char>_> *in,uint128 *value)

{
  uint128 b;
  uint128 a;
  uint128 a_00;
  uint128 b_00;
  uint128 a_01;
  uint128 b_01;
  uint128 a_02;
  bool bVar1;
  _Ios_Fmtflags c;
  int_type iVar2;
  uint64_t *in_RSI;
  istream *in_RDI;
  int pos;
  uint128 result_2;
  uint128 mult_overflow_2;
  uint128 next_digit;
  uint128 result_1;
  uint128 max;
  uint128 mult_overflow_1;
  uint128 result;
  uint128 mult_overflow;
  anon_class_1_0_00000001 hex_digit_to_uint128;
  anon_class_1_0_00000001 is_hex_basechar;
  anon_class_1_0_00000001 is_hex_digit;
  anon_class_1_0_00000001 oct_digit_to_uint128;
  anon_class_1_0_00000001 is_oct_digit;
  anon_class_1_0_00000001 dec_digit_to_uint128;
  anon_class_1_0_00000001 is_dec_digit;
  fmtflags stream_flags;
  bool local_1b6;
  bool local_1b5;
  anon_class_1_0_00000001 *this;
  uint128 in_stack_fffffffffffffe50;
  uint128 in_stack_fffffffffffffe60;
  int local_16c;
  uint128 local_168;
  uint128 local_158;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  uint64_t local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint128 local_118;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint128 *this_00;
  uint128 in_stack_ffffffffffffff18;
  uint128 local_b8;
  uint128 local_a8;
  uint128 local_98;
  uint128 local_88;
  uint128 local_78;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint128 local_48;
  uint128 local_38;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21 [2];
  anon_class_1_0_00000001 local_1f [2];
  anon_class_1_0_00000001 local_1d;
  _Ios_Fmtflags local_1c;
  uint64_t *local_18;
  istream *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  std::istream::operator>>(local_10,std::ws<char,std::char_traits<char>>);
  c = Catch::clara::std::operator&(local_1c,_S_basefield);
  if (c != _S_dec) {
    if (c == _S_hex) {
      portable_impl::uint128::uint128(&local_158,0x1000000000000000,0);
      iVar2 = std::istream::peek();
      bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
              anon_class_1_0_00000001::operator()(local_21,iVar2);
      if (!bVar1) {
        std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
        return (basic_istream<char,_std::char_traits<char>_> *)local_10;
      }
      portable_impl::uint128::uint128(&local_168);
      local_16c = 0;
      do {
        iVar2 = std::istream::peek();
        bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                anon_class_1_0_00000001::operator()(local_21,iVar2);
        local_1b5 = true;
        if (!bVar1) {
          local_1b6 = false;
          if (local_16c == 1) {
            iVar2 = std::istream::peek();
            local_1b6 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                        anon_class_1_0_00000001::operator()(&local_22,iVar2);
          }
          local_1b5 = local_1b6;
        }
        this = (anon_class_1_0_00000001 *)in_stack_fffffffffffffe50.m_lo;
        if (local_1b5 == false) {
          *local_18 = local_168.m_lo;
          local_18[1] = local_168.m_hi;
          return (basic_istream<char,_std::char_traits<char>_> *)local_10;
        }
        if (local_16c == 1) {
          iVar2 = std::istream::peek();
          bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                  anon_class_1_0_00000001::operator()(&local_22,iVar2);
          this = (anon_class_1_0_00000001 *)in_stack_fffffffffffffe50.m_lo;
          if (!bVar1) goto LAB_00457942;
          std::istream::get();
        }
        else {
LAB_00457942:
          a.m_hi = local_168.m_hi;
          a.m_lo = local_168.m_lo;
          b.m_hi = local_158.m_hi;
          b.m_lo = local_158.m_lo;
          bVar1 = portable_impl::operator>=(a,b);
          if (bVar1) {
            std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
            return (basic_istream<char,_std::char_traits<char>_> *)local_10;
          }
          portable_impl::uint128::uint128((uint128 *)&stack0xfffffffffffffe60,0x10);
          portable_impl::uint128::operator*=(this_00,in_stack_ffffffffffffff18);
          std::istream::get();
          in_stack_fffffffffffffe50 =
               operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
               anon_class_1_0_00000001::operator()(this,c);
          portable_impl::uint128::operator+=(&local_168,in_stack_fffffffffffffe50);
        }
        local_16c = local_16c + 1;
      } while( true );
    }
    if (c == _S_oct) {
      portable_impl::uint128::uint128(&local_38,0x2000000000000000,0);
      iVar2 = std::istream::peek();
      bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
              anon_class_1_0_00000001::operator()(local_1f,iVar2);
      if (!bVar1) {
        std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
        return (basic_istream<char,_std::char_traits<char>_> *)local_10;
      }
      portable_impl::uint128::uint128(&local_48);
      while( true ) {
        iVar2 = std::istream::peek();
        bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                anon_class_1_0_00000001::operator()(local_1f,iVar2);
        if (!bVar1) {
          *local_18 = local_48.m_lo;
          local_18[1] = local_48.m_hi;
          return (basic_istream<char,_std::char_traits<char>_> *)local_10;
        }
        local_58 = local_48.m_lo;
        local_50 = local_48.m_hi;
        local_68 = local_38.m_lo;
        local_60 = local_38.m_hi;
        a_02.m_hi = local_48.m_hi;
        a_02.m_lo = local_48.m_lo;
        b_01.m_hi = local_38.m_hi;
        b_01.m_lo = local_38.m_lo;
        bVar1 = portable_impl::operator>=(a_02,b_01);
        if (bVar1) break;
        portable_impl::uint128::uint128(&local_78,8);
        portable_impl::uint128::operator*=(this_00,in_stack_ffffffffffffff18);
        std::istream::get();
        local_88 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                   anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)in_stack_fffffffffffffe50.m_lo,c);
        portable_impl::uint128::operator+=(&local_48,local_88);
      }
      std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
      return (basic_istream<char,_std::char_traits<char>_> *)local_10;
    }
  }
  portable_impl::uint128::uint128(&local_98,0x1999999999999999,0x999999999999999a);
  portable_impl::uint128::uint128(&local_a8,0xffffffffffffffff,0xffffffffffffffff);
  iVar2 = std::istream::peek();
  bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
          anon_class_1_0_00000001::operator()(&local_1d,iVar2);
  if (!bVar1) {
    std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
    return (basic_istream<char,_std::char_traits<char>_> *)local_10;
  }
  portable_impl::uint128::uint128(&local_b8);
  while( true ) {
    iVar2 = std::istream::peek();
    bVar1 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
            anon_class_1_0_00000001::operator()(&local_1d,iVar2);
    if (!bVar1) {
      *local_18 = local_b8.m_lo;
      local_18[1] = local_b8.m_hi;
      return (basic_istream<char,_std::char_traits<char>_> *)local_10;
    }
    a_01.m_hi = local_b8.m_hi;
    a_01.m_lo = local_b8.m_lo;
    b_00.m_hi = local_98.m_hi;
    b_00.m_lo = local_98.m_lo;
    bVar1 = portable_impl::operator>=(a_01,b_00);
    if (bVar1) break;
    portable_impl::uint128::uint128((uint128 *)&stack0xffffffffffffff18,10);
    portable_impl::uint128::operator*=(this_00,in_stack_ffffffffffffff18);
    std::istream::get();
    _local_f8 = operator>><char,_std::char_traits<char>,_trng::portable_impl::uint128>::
                anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffffe50.m_lo,c);
    local_108 = local_f8;
    local_128 = local_a8.m_lo;
    local_120 = local_a8.m_hi;
    local_138 = local_b8.m_lo;
    local_130 = local_b8.m_hi;
    local_100 = (uint64_t)this_00;
    local_118 = portable_impl::operator-(in_stack_fffffffffffffe60,in_stack_fffffffffffffe50);
    a_00.m_hi = local_100;
    a_00.m_lo = local_108;
    bVar1 = portable_impl::operator>(a_00,local_118);
    if (bVar1) {
      std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
      return (basic_istream<char,_std::char_traits<char>_> *)local_10;
    }
    local_148 = local_f8;
    local_140 = (uint64_t)this_00;
    portable_impl::uint128::operator+=(&local_b8,_local_f8);
  }
  std::ios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
  return (basic_istream<char,_std::char_traits<char>_> *)local_10;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }